

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::BitstringPropagateStats
          (duckdb *this,ClientContext *context,BoundAggregateExpression *expr,
          AggregateStatisticsInput *input)

{
  FunctionData *pFVar1;
  bool bVar2;
  reference pvVar3;
  Value local_60;
  
  pvVar3 = vector<duckdb::BaseStatistics,_true>::operator[](input->child_stats,0);
  bVar2 = NumericStats::HasMinMax(pvVar3);
  if (bVar2) {
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
    pFVar1 = (input->bind_data).ptr;
    pvVar3 = vector<duckdb::BaseStatistics,_true>::operator[](input->child_stats,0);
    NumericStats::Min(&local_60,pvVar3);
    Value::operator=((Value *)(pFVar1 + 1),&local_60);
    Value::~Value(&local_60);
    pvVar3 = vector<duckdb::BaseStatistics,_true>::operator[](input->child_stats,0);
    NumericStats::Max(&local_60,pvVar3);
    Value::operator=((Value *)(pFVar1 + 9),&local_60);
    Value::~Value(&local_60);
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> BitstringPropagateStats(ClientContext &context, BoundAggregateExpression &expr,
                                                   AggregateStatisticsInput &input) {

	if (NumericStats::HasMinMax(input.child_stats[0])) {
		auto &bind_agg_data = input.bind_data->Cast<BitstringAggBindData>();
		bind_agg_data.min = NumericStats::Min(input.child_stats[0]);
		bind_agg_data.max = NumericStats::Max(input.child_stats[0]);
	}
	return nullptr;
}